

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O3

void __thiscall cmCTestLaunch::RunChild(cmCTestLaunch *this)

{
  pointer pbVar1;
  cmsysProcess *cp;
  long lVar2;
  undefined8 uVar3;
  int iVar4;
  cmProcessOutput processOutput;
  int length;
  string strdata;
  char *data;
  ofstream ferr;
  ofstream fout;
  cmProcessOutput local_49d;
  int local_49c;
  string local_498;
  char *local_478;
  string local_470;
  string local_450;
  long local_430;
  filebuf local_428 [240];
  ios_base aiStack_338 [264];
  long local_230;
  filebuf local_228 [240];
  ios_base aiStack_138 [264];
  
  pbVar1 = (this->RealArgs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pbVar1 != (this->RealArgs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
     (iVar4 = std::__cxx11::string::compare((char *)pbVar1), iVar4 != 0)) {
    cp = this->Process;
    cmsysProcess_SetCommand(cp,this->RealArgV);
    std::ofstream::ofstream(&local_230);
    std::ofstream::ofstream(&local_430);
    if (this->Passthru == true) {
      cmsysProcess_SetPipeShared(cp,2,1);
      cmsysProcess_SetPipeShared(cp,3,1);
    }
    else {
      std::ofstream::open((char *)&local_230,(_Ios_Openmode)(this->LogOut)._M_dataplus._M_p);
      std::ofstream::open((char *)&local_430,(_Ios_Openmode)(this->LogErr)._M_dataplus._M_p);
    }
    cmsysProcess_Execute(cp);
    if (this->Passthru == false) {
      local_478 = (char *)0x0;
      local_49c = 0;
      cmProcessOutput::cmProcessOutput(&local_49d,Auto,0x400);
      local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
      local_498._M_string_length = 0;
      local_498.field_2._M_local_buf[0] = '\0';
      do {
        while( true ) {
          while (iVar4 = cmsysProcess_WaitForData(cp,&local_478,&local_49c,(double *)0x0),
                iVar4 == 2) {
            cmProcessOutput::DecodeText(&local_49d,local_478,(long)local_49c,&local_498,1);
            std::ostream::write((char *)&local_230,(long)local_498._M_dataplus._M_p);
            std::ostream::write((char *)&std::cout,(long)local_498._M_dataplus._M_p);
            this->HaveOut = true;
          }
          if (iVar4 != 3) break;
          cmProcessOutput::DecodeText(&local_49d,local_478,(long)local_49c,&local_498,2);
          std::ostream::write((char *)&local_430,(long)local_498._M_dataplus._M_p);
          std::ostream::write((char *)&std::cerr,(long)local_498._M_dataplus._M_p);
          this->HaveErr = true;
        }
      } while (iVar4 != 0);
      local_450._M_string_length = 0;
      local_450.field_2._M_local_buf[0] = '\0';
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      cmProcessOutput::DecodeText(&local_49d,&local_450,&local_498,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,
                        CONCAT71(local_450.field_2._M_allocated_capacity._1_7_,
                                 local_450.field_2._M_local_buf[0]) + 1);
      }
      if (local_498._M_string_length != 0) {
        std::ostream::write((char *)&local_230,(long)local_498._M_dataplus._M_p);
        std::ostream::write((char *)&std::cout,(long)local_498._M_dataplus._M_p);
      }
      local_470._M_string_length = 0;
      local_470.field_2._M_local_buf[0] = '\0';
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      cmProcessOutput::DecodeText(&local_49d,&local_470,&local_498,2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,
                        CONCAT71(local_470.field_2._M_allocated_capacity._1_7_,
                                 local_470.field_2._M_local_buf[0]) + 1);
      }
      if (local_498._M_string_length != 0) {
        std::ostream::write((char *)&local_430,(long)local_498._M_dataplus._M_p);
        std::ostream::write((char *)&std::cerr,(long)local_498._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,
                        CONCAT71(local_498.field_2._M_allocated_capacity._1_7_,
                                 local_498.field_2._M_local_buf[0]) + 1);
      }
      cmProcessOutput::~cmProcessOutput(&local_49d);
    }
    cmsysProcess_WaitForExit(cp,(double *)0x0);
    iVar4 = cmsysProcess_GetExitValue(cp);
    this->ExitCode = iVar4;
    uVar3 = _vtable;
    lVar2 = _VTT;
    local_430 = _VTT;
    *(undefined8 *)(local_428 + *(long *)(_VTT + -0x18) + -8) = _vtable;
    std::filebuf::~filebuf(local_428);
    std::ios_base::~ios_base(aiStack_338);
    local_230 = lVar2;
    *(undefined8 *)(local_228 + *(long *)(lVar2 + -0x18) + -8) = uVar3;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(aiStack_138);
    return;
  }
  this->ExitCode = 0;
  return;
}

Assistant:

void cmCTestLaunch::RunChild()
{
  // Ignore noopt make rules
  if (this->RealArgs.empty() || this->RealArgs[0] == ":") {
    this->ExitCode = 0;
    return;
  }

  // Prepare to run the real command.
  cmsysProcess* cp = this->Process;
  cmsysProcess_SetCommand(cp, this->RealArgV);

  cmsys::ofstream fout;
  cmsys::ofstream ferr;
  if (this->Passthru) {
    // In passthru mode we just share the output pipes.
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDOUT, 1);
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDERR, 1);
  } else {
    // In full mode we record the child output pipes to log files.
    fout.open(this->LogOut.c_str(), std::ios::out | std::ios::binary);
    ferr.open(this->LogErr.c_str(), std::ios::out | std::ios::binary);
  }

#ifdef _WIN32
  // Do this so that newline transformation is not done when writing to cout
  // and cerr below.
  _setmode(fileno(stdout), _O_BINARY);
  _setmode(fileno(stderr), _O_BINARY);
#endif

  // Run the real command.
  cmsysProcess_Execute(cp);

  // Record child stdout and stderr if necessary.
  if (!this->Passthru) {
    char* data = nullptr;
    int length = 0;
    cmProcessOutput processOutput;
    std::string strdata;
    while (int p = cmsysProcess_WaitForData(cp, &data, &length, nullptr)) {
      if (p == cmsysProcess_Pipe_STDOUT) {
        processOutput.DecodeText(data, length, strdata, 1);
        fout.write(strdata.c_str(), strdata.size());
        std::cout.write(strdata.c_str(), strdata.size());
        this->HaveOut = true;
      } else if (p == cmsysProcess_Pipe_STDERR) {
        processOutput.DecodeText(data, length, strdata, 2);
        ferr.write(strdata.c_str(), strdata.size());
        std::cerr.write(strdata.c_str(), strdata.size());
        this->HaveErr = true;
      }
    }
    processOutput.DecodeText(std::string(), strdata, 1);
    if (!strdata.empty()) {
      fout.write(strdata.c_str(), strdata.size());
      std::cout.write(strdata.c_str(), strdata.size());
    }
    processOutput.DecodeText(std::string(), strdata, 2);
    if (!strdata.empty()) {
      ferr.write(strdata.c_str(), strdata.size());
      std::cerr.write(strdata.c_str(), strdata.size());
    }
  }

  // Wait for the real command to finish.
  cmsysProcess_WaitForExit(cp, nullptr);
  this->ExitCode = cmsysProcess_GetExitValue(cp);
}